

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEditPrivate::updatePlaceholderVisibility(QPlainTextEditPrivate *this)

{
  long lVar1;
  QArrayData *pQVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  
  cVar4 = this->field_0x348;
  lVar1 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
  QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar1 + 8) + 800));
  cVar3 = QTextDocument::isEmpty();
  if (cVar3 == '\0') {
    if (-1 < cVar4) {
      return;
    }
  }
  else {
    lVar1 = *(long *)(lVar1 + 8);
    pQVar2 = *(QArrayData **)(lVar1 + 0x308);
    lVar1 = *(long *)(lVar1 + 0x318);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (-1 < cVar4 != (lVar1 != 0)) {
      return;
    }
  }
  QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
  lVar1 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
  QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar1 + 8) + 800));
  cVar4 = QTextDocument::isEmpty();
  if (cVar4 == '\0') {
    bVar5 = this->field_0x348;
  }
  else {
    lVar1 = *(long *)(lVar1 + 8);
    pQVar2 = *(QArrayData **)(lVar1 + 0x308);
    lVar1 = *(long *)(lVar1 + 0x318);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    bVar5 = this->field_0x348;
    if (lVar1 != 0) {
      bVar6 = 0x80;
      goto LAB_004977f5;
    }
  }
  bVar6 = 0;
LAB_004977f5:
  this->field_0x348 = bVar5 & 0x7f | bVar6;
  return;
}

Assistant:

void QPlainTextEditPrivate::updatePlaceholderVisibility()
{
    // We normally only repaint the part of view that contains text in the
    // document that has changed (in repaintContents). But the placeholder
    // text is not a part of the document, but is drawn on separately. So whenever
    // we either show or hide the placeholder text, we issue a full update.
    if (placeholderTextShown != placeHolderTextToBeShown()) {
        viewport->update();
        placeholderTextShown = placeHolderTextToBeShown();
    }
}